

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O1

void __thiscall duckdb::HashJoinRepartitionEvent::FinishEvent(HashJoinRepartitionEvent *this)

{
  vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_true>
  *pvVar1;
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_> *puVar2;
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_> *puVar3;
  HashJoinGlobalSinkState *pHVar4;
  ClientContext *context;
  PhysicalHashJoin *pPVar5;
  idx_t iVar6;
  pointer pJVar7;
  idx_t iVar8;
  pointer pTVar9;
  ulong uVar10;
  uint64_t uVar11;
  type pipeline;
  uint64_t uVar12;
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_> *this_00;
  size_type __n;
  double dVar13;
  vector<unsigned_long,_true> partition_counts;
  vector<unsigned_long,_true> partition_sizes;
  allocator_type local_61;
  value_type_conflict1 local_60;
  vector<unsigned_long,_true> local_58;
  vector<unsigned_long,_true> local_40;
  
  pvVar1 = this->local_hts;
  puVar2 = &((pvVar1->
             super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super_unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>;
  puVar3 = &((pvVar1->
             super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super_unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>;
  this_00 = puVar2;
  if (puVar3 != puVar2) {
    do {
      ::std::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>::
      ~unique_ptr(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != puVar3);
    (pvVar1->
    super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
    ).
    super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2;
  }
  pJVar7 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&this->sink->hash_table);
  __n = 1L << ((byte)pJVar7->radix_bits & 0x3f);
  local_58.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,__n,
             (value_type_conflict1 *)&local_58,(allocator_type *)&local_60);
  local_60 = 0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,__n,&local_60,
             &local_61);
  pJVar7 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&this->sink->hash_table);
  iVar8 = JoinHashTable::GetTotalSize
                    (pJVar7,&local_40,&local_58,&this->sink->max_partition_size,
                     &this->sink->max_partition_count);
  pHVar4 = this->sink;
  pHVar4->total_size = iVar8;
  context = pHVar4->context;
  pPVar5 = this->op;
  pJVar7 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&pHVar4->hash_table);
  iVar8 = GetPartitioningSpaceRequirement
                    (context,&(pPVar5->super_PhysicalComparisonJoin).super_PhysicalJoin.
                              super_CachingPhysicalOperator.super_PhysicalOperator.types,
                     pJVar7->radix_bits,this->sink->num_threads);
  pHVar4 = this->sink;
  pHVar4->probe_side_requirement = iVar8;
  pTVar9 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->(&pHVar4->temporary_memory_state);
  iVar6 = this->sink->max_partition_size;
  pJVar7 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&this->sink->hash_table);
  iVar8 = this->sink->max_partition_count;
  dVar13 = (((double)CONCAT44(0x45300000,(int)(iVar8 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)iVar8) - 4503599627370496.0)) * pJVar7->load_factor;
  uVar10 = (ulong)dVar13;
  uVar11 = NextPowerOfTwo((long)(dVar13 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10);
  uVar12 = 0x4000;
  if (0x4000 < uVar11) {
    uVar12 = uVar11;
  }
  TemporaryMemoryState::SetMinimumReservation
            (pTVar9,iVar6 + uVar12 * 8 + this->sink->probe_side_requirement);
  pTVar9 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->(&this->sink->temporary_memory_state);
  TemporaryMemoryState::UpdateReservation
            (pTVar9,((this->super_BasePipelineEvent).super_Event.executor)->context);
  pJVar7 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&this->sink->hash_table);
  pTVar9 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->(&this->sink->temporary_memory_state);
  iVar8 = TemporaryMemoryState::GetReservation(pTVar9);
  JoinHashTable::PrepareExternalFinalize(pJVar7,iVar8 - this->sink->probe_side_requirement);
  pHVar4 = this->sink;
  pipeline = shared_ptr<duckdb::Pipeline,_true>::operator*
                       (&(this->super_BasePipelineEvent).pipeline);
  HashJoinGlobalSinkState::ScheduleFinalize(pHVar4,pipeline,(Event *)this);
  if (local_58.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_40.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FinishEvent() override {
		local_hts.clear();

		// Minimum reservation is now the new smallest partition size
		const auto num_partitions = RadixPartitioning::NumberOfPartitions(sink.hash_table->GetRadixBits());
		vector<idx_t> partition_sizes(num_partitions, 0);
		vector<idx_t> partition_counts(num_partitions, 0);
		sink.total_size = sink.hash_table->GetTotalSize(partition_sizes, partition_counts, sink.max_partition_size,
		                                                sink.max_partition_count);
		sink.probe_side_requirement =
		    GetPartitioningSpaceRequirement(sink.context, op.types, sink.hash_table->GetRadixBits(), sink.num_threads);

		sink.temporary_memory_state->SetMinimumReservation(sink.max_partition_size +
		                                                   sink.hash_table->PointerTableSize(sink.max_partition_count) +
		                                                   sink.probe_side_requirement);
		sink.temporary_memory_state->UpdateReservation(executor.context);

		D_ASSERT(sink.temporary_memory_state->GetReservation() >= sink.probe_side_requirement);
		sink.hash_table->PrepareExternalFinalize(sink.temporary_memory_state->GetReservation() -
		                                         sink.probe_side_requirement);
		sink.ScheduleFinalize(*pipeline, *this);
	}